

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

long __thiscall
duckdb::Interpolator<true>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<true> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  Vector *result_00;
  long lVar1;
  long *in_RCX;
  long *in_stack_00000028;
  Interpolator<true> *in_stack_00000030;
  
  result_00 = (Vector *)
              InterpolateInternal<long,duckdb::QuantileDirect<long>>
                        (in_stack_00000030,in_stack_00000028,(QuantileDirect<long> *)this);
  lVar1 = CastInterpolation::Cast<long,long>(in_RCX,result_00);
  return lVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}